

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::ProfileHandlerTest_RegisterCallbackBeforeThread_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ProfileHandlerTest_RegisterCallbackBeforeThread_Test>
           *this)

{
  ProfileHandlerTest *this_00;
  
  this_00 = (ProfileHandlerTest *)anon_unknown.dwarf_3b15::do_allocate(0x18);
  anon_unknown.dwarf_3b15::ProfileHandlerTest::ProfileHandlerTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00145f70;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }